

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

uint __thiscall
glslang::TIntermediate::computeTypeXfbSize
          (TIntermediate *this,TType *type,bool *contains64BitType,bool *contains32BitType,
          bool *contains16BitType)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_00;
  size_type sVar7;
  uint local_184;
  int numComponents;
  int memberSize;
  bool memberContains16BitType;
  bool memberContains32BitType;
  bool memberContains64BitType;
  TType memberType;
  int member;
  undefined1 local_d0;
  bool structContains16BitType;
  bool structContains32BitType;
  bool structContains64BitType;
  uint size;
  TType elementType;
  bool *contains16BitType_local;
  bool *contains32BitType_local;
  bool *contains64BitType_local;
  TType *type_local;
  TIntermediate *this_local;
  
  elementType.spirvType = (TSpirvType *)contains16BitType;
  uVar4 = (*type->_vptr_TType[0x1e])();
  if ((uVar4 & 1) == 0) {
    uVar4 = (*type->_vptr_TType[0x25])();
    if ((uVar4 & 1) == 0) {
      uVar4 = (*type->_vptr_TType[0x18])();
      if ((uVar4 & 1) == 0) {
        uVar4 = (*type->_vptr_TType[0x1b])();
        if ((uVar4 & 1) == 0) {
          uVar4 = (*type->_vptr_TType[0x1c])();
          if ((uVar4 & 1) == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                          ,0x865,
                          "unsigned int glslang::TIntermediate::computeTypeXfbSize(const TType &, bool &, bool &, bool &) const"
                         );
          }
          iVar5 = (*type->_vptr_TType[0xd])();
          iVar6 = (*type->_vptr_TType[0xe])();
          local_184 = iVar5 * iVar6;
        }
        else {
          local_184 = (*type->_vptr_TType[0xc])();
        }
      }
      else {
        local_184 = 1;
      }
      iVar5 = (*type->_vptr_TType[7])();
      if (((iVar5 == 2) || (iVar5 = (*type->_vptr_TType[7])(), iVar5 == 10)) ||
         (iVar5 = (*type->_vptr_TType[7])(), iVar5 == 0xb)) {
        *contains64BitType = true;
        this_local._4_4_ = local_184 << 3;
      }
      else {
        iVar5 = (*type->_vptr_TType[7])();
        if (((iVar5 == 3) || (iVar5 = (*type->_vptr_TType[7])(), iVar5 == 6)) ||
           (iVar5 = (*type->_vptr_TType[7])(), iVar5 == 7)) {
          *(undefined1 *)
           &((elementType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.allocator = 1;
          this_local._4_4_ = local_184 << 1;
        }
        else {
          iVar5 = (*type->_vptr_TType[7])();
          if ((iVar5 == 4) || (iVar5 = (*type->_vptr_TType[7])(), iVar5 == 5)) {
            this_local._4_4_ = local_184;
          }
          else {
            *contains32BitType = true;
            this_local._4_4_ = local_184 << 2;
          }
        }
      }
    }
    else {
      member = 0;
      bVar1 = false;
      bVar2 = false;
      bVar3 = false;
      memberType.spirvType._4_4_ = 0;
      while( true ) {
        iVar5 = memberType.spirvType._4_4_;
        this_00 = &TType::getStruct(type)->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
        sVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                          (this_00);
        if ((int)sVar7 <= iVar5) break;
        TType::TType((TType *)&memberSize,type,memberType.spirvType._4_4_,false);
        numComponents._3_1_ = 0;
        numComponents._2_1_ = 0;
        numComponents._1_1_ = 0;
        uVar4 = computeTypeXfbSize(this,(TType *)&memberSize,(bool *)((long)&numComponents + 3),
                                   (bool *)((long)&numComponents + 2),
                                   (bool *)((long)&numComponents + 1));
        if ((numComponents._3_1_ & 1) == 0) {
          if ((numComponents._2_1_ & 1) == 0) {
            if ((numComponents._1_1_ & 1) != 0) {
              bVar3 = true;
              RoundToPow2<unsigned_int>((uint *)&member,2);
            }
          }
          else {
            bVar2 = true;
            RoundToPow2<unsigned_int>((uint *)&member,4);
          }
        }
        else {
          bVar1 = true;
          RoundToPow2<unsigned_int>((uint *)&member,8);
        }
        member = uVar4 + member;
        TType::~TType((TType *)&memberSize);
        memberType.spirvType._4_4_ = memberType.spirvType._4_4_ + 1;
      }
      if (bVar1) {
        *contains64BitType = true;
        RoundToPow2<unsigned_int>((uint *)&member,8);
      }
      else if (bVar2) {
        *contains32BitType = true;
        RoundToPow2<unsigned_int>((uint *)&member,4);
      }
      else if (bVar3) {
        *(undefined1 *)
         &((elementType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.allocator = 1;
        RoundToPow2<unsigned_int>((uint *)&member,2);
      }
      this_local._4_4_ = member;
    }
  }
  else {
    TType::TType((TType *)&local_d0,type,0,false);
    iVar5 = (*type->_vptr_TType[0xf])();
    uVar4 = computeTypeXfbSize(this,(TType *)&local_d0,contains64BitType,
                               (bool *)elementType.spirvType,(bool *)elementType.spirvType);
    this_local._4_4_ = iVar5 * uVar4;
    TType::~TType((TType *)&local_d0);
  }
  return this_local._4_4_;
}

Assistant:

unsigned int TIntermediate::computeTypeXfbSize(const TType& type, bool& contains64BitType, bool& contains32BitType, bool& contains16BitType) const
{
    // "...if applied to an aggregate containing a double or 64-bit integer, the offset must also be a multiple of 8,
    // and the space taken in the buffer will be a multiple of 8.
    // ...within the qualified entity, subsequent components are each
    // assigned, in order, to the next available offset aligned to a multiple of
    // that component's size.  Aggregate types are flattened down to the component
    // level to get this sequence of components."

    if (type.isSizedArray()) {
        // TODO: perf: this can be flattened by using getCumulativeArraySize(), and a deref that discards all arrayness
        // Unsized array use to xfb should be a compile error.
        TType elementType(type, 0);
        return type.getOuterArraySize() * computeTypeXfbSize(elementType, contains64BitType, contains16BitType, contains16BitType);
    }

    if (type.isStruct()) {
        unsigned int size = 0;
        bool structContains64BitType = false;
        bool structContains32BitType = false;
        bool structContains16BitType = false;
        for (int member = 0; member < (int)type.getStruct()->size(); ++member) {
            TType memberType(type, member);
            // "... if applied to
            // an aggregate containing a double or 64-bit integer, the offset must also be a multiple of 8,
            // and the space taken in the buffer will be a multiple of 8."
            bool memberContains64BitType = false;
            bool memberContains32BitType = false;
            bool memberContains16BitType = false;
            int memberSize = computeTypeXfbSize(memberType, memberContains64BitType, memberContains32BitType, memberContains16BitType);
            if (memberContains64BitType) {
                structContains64BitType = true;
                RoundToPow2(size, 8);
            } else if (memberContains32BitType) {
                structContains32BitType = true;
                RoundToPow2(size, 4);
            } else if (memberContains16BitType) {
                structContains16BitType = true;
                RoundToPow2(size, 2);
            }
            size += memberSize;
        }

        if (structContains64BitType) {
            contains64BitType = true;
            RoundToPow2(size, 8);
        } else if (structContains32BitType) {
            contains32BitType = true;
            RoundToPow2(size, 4);
        } else if (structContains16BitType) {
            contains16BitType = true;
            RoundToPow2(size, 2);
        }
        return size;
    }

    int numComponents {0};
    if (type.isScalar())
        numComponents = 1;
    else if (type.isVector())
        numComponents = type.getVectorSize();
    else if (type.isMatrix())
        numComponents = type.getMatrixCols() * type.getMatrixRows();
    else {
        assert(0);
        numComponents = 1;
    }

    if (type.getBasicType() == EbtDouble || type.getBasicType() == EbtInt64 || type.getBasicType() == EbtUint64) {
        contains64BitType = true;
        return 8 * numComponents;
    } else if (type.getBasicType() == EbtFloat16 || type.getBasicType() == EbtInt16 || type.getBasicType() == EbtUint16) {
        contains16BitType = true;
        return 2 * numComponents;
    } else if (type.getBasicType() == EbtInt8 || type.getBasicType() == EbtUint8)
        return numComponents;
    else {
        contains32BitType = true;
        return 4 * numComponents;
    }
}